

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deUniquePtr.hpp
# Opt level: O2

void __thiscall
de::details::UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>::
reset(UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_> *this)

{
  DescriptorPoolBuilder *ptr;
  
  ptr = (this->m_data).ptr;
  if (ptr != (DescriptorPoolBuilder *)0x0) {
    DefaultDeleter<vk::DescriptorPoolBuilder>::operator()
              ((DefaultDeleter<vk::DescriptorPoolBuilder> *)&(this->m_data).field_0x8,ptr);
    (this->m_data).ptr = (DescriptorPoolBuilder *)0x0;
  }
  return;
}

Assistant:

void UniqueBase<T, D>::reset (void)
{
	if (m_data.ptr != DE_NULL)
	{
		m_data.deleter(m_data.ptr);
		m_data.ptr = DE_NULL;
	}
}